

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableRead.cpp
# Opt level: O0

void __thiscall
ninx::parser::element::VariableRead::VariableRead(VariableRead *this,string *name,int suffix_spaces)

{
  int suffix_spaces_local;
  string *name_local;
  VariableRead *this_local;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__VariableRead_001c7160;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  this->trailing_spaces = suffix_spaces;
  return;
}

Assistant:

ninx::parser::element::VariableRead::VariableRead(const std::string &name, int suffix_spaces)
        : name(name), trailing_spaces(suffix_spaces) {}